

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

ON_Interval __thiscall ON_PolyCurve::Domain(ON_PolyCurve *this)

{
  double dVar1;
  int i;
  int iVar2;
  double *pdVar3;
  int count;
  ON_PolyCurve *this_local;
  ON_Interval d;
  
  ON_Interval::ON_Interval((ON_Interval *)&this_local);
  i = Count(this);
  if (0 < i) {
    iVar2 = ON_SimpleArray<double>::Count(&this->m_t);
    if (i + 1 == iVar2) {
      pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,0);
      dVar1 = *pdVar3;
      pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,i);
      if (dVar1 < *pdVar3) {
        pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,0);
        dVar1 = *pdVar3;
        pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,i);
        ON_Interval::Set((ON_Interval *)&this_local,dVar1,*pdVar3);
      }
    }
  }
  return (ON_Interval)_this_local;
}

Assistant:

ON_Interval ON_PolyCurve::Domain() const
{
  ON_Interval d;
  const int count = Count();
  if ( count > 0 && count+1 == m_t.Count() && m_t[0] < m_t[count] ) {
    d.Set(m_t[0],m_t[count]);
  }
  return d;
}